

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Issue.cpp
# Opt level: O2

ostream * jbcoin::operator<<(ostream *os,Issue *x)

{
  Issue *in_RDX;
  string local_30;
  
  to_string_abi_cxx11_(&local_30,(jbcoin *)x,in_RDX);
  std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream& os, Issue const& x)
{
    os << to_string (x);
    return os;
}